

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_leader.cpp
# Opt level: O1

bool __thiscall
ON_Leader::GetTextXform
          (ON_Leader *this,ON_Xform *model_xform,ON_Viewport *vp,ON_DimStyle *dimstyle,
          double dimscale,ON_Xform *text_xform_out)

{
  ON_2dPoint *pOVar1;
  ON_3dVector axis;
  ON_3dPoint point_on_mirror_plane;
  ON_3dPoint point_on_mirror_plane_00;
  ON_3dPoint center;
  ON_3dVector normal_to_mirror_plane;
  ON_3dVector normal_to_mirror_plane_00;
  ON_Leader *this_00;
  ON_Viewport *this_01;
  MaskFrame MVar2;
  ContentAngleStyle CVar3;
  TextHorizontalAlignment halign;
  TextVerticalAlignment TVar4;
  TextHorizontalAlignment TVar5;
  bool bVar6;
  TextOrientation TVar7;
  view_projection vVar8;
  ON_TextContent *this_02;
  ON_Plane *pOVar9;
  wchar_t *pwVar10;
  ON_TextMask *this_03;
  ON_Plane *pOVar11;
  long lVar12;
  ON_Xform *pOVar13;
  ON_Xform *pOVar14;
  ON_Xform *pOVar15;
  byte bVar16;
  undefined4 uVar17;
  uint uVar18;
  undefined4 uVar19;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar20;
  ON_2dVector OVar21;
  ON_2dPoint OVar22;
  bool flip_y;
  bool flip_x;
  ON_2dVector tail_dir;
  ON_3dVector view_x;
  ON_3dVector text_ydir;
  ON_3dVector text_xdir;
  ON_3dVector view_y;
  ON_Xform mxf;
  ON_3dVector text_zdir;
  ON_wString rtfstr;
  ON_3dVector view_z;
  ON_2dPoint text_corners [4];
  ON_Xform textrotation_xf;
  ON_3dPoint text_point_3d;
  ON_2dPoint text_pt;
  ON_Xform textcenter_xf;
  ON_Xform leader_to_text_pt_xf;
  ON_Plane objectplane;
  ON_Xform world_to_leader_xf;
  bool local_5d2;
  bool local_5d1;
  double local_5d0;
  ON_2dPoint local_5c8;
  double local_5b8;
  double local_5b0;
  double local_5a8;
  double local_5a0;
  ON_Xform *local_598;
  ON_Leader *local_590;
  ON_2dVector local_588;
  ON_2dVector local_578;
  double local_568;
  double local_560;
  ON_Xform *local_558;
  ON_Viewport *local_550;
  ON_3dVector local_548;
  ON_3dVector local_528;
  ON_3dVector local_508;
  ON_3dVector local_4e8;
  double local_4d0;
  ON_Xform local_4c8;
  ON_3dVector local_448;
  ON_Xform local_430;
  ON_3dVector local_3b0;
  undefined1 local_398 [16];
  ON_2dPoint local_388;
  double local_378;
  ON_2dPoint local_368;
  double local_350;
  ON_Xform local_340;
  ON_Xform local_2c0;
  ON_2dPoint local_240;
  ON_Xform local_230;
  ON_Xform local_1b0;
  ON_Plane local_130;
  ON_Xform local_b0;
  
  bVar16 = 0;
  if ((dimstyle == (ON_DimStyle *)0x0) ||
     (local_598 = model_xform, local_560 = dimscale, local_558 = text_xform_out, local_550 = vp,
     this_02 = ON_Annotation::Text(&this->super_ON_Annotation), this_02 == (ON_TextContent *)0x0))
  goto LAB_004c8b2c;
  MVar2 = ON_DimStyle::MaskFrameType(dimstyle);
  local_5a8 = (double)CONCAT71(local_5a8._1_7_,MVar2);
  CVar3 = ON_DimStyle::LeaderContentAngleStyle(dimstyle);
  local_590 = this;
  OVar21 = TailDirection(this,dimstyle);
  this_01 = local_550;
  local_578.y = OVar21.y;
  local_578.x = OVar21.x;
  if (local_550 == (ON_Viewport *)0x0) {
    local_548.z = ON_3dVector::XAxis.z;
    local_548.x = ON_3dVector::XAxis.x;
    local_548.y = ON_3dVector::XAxis.y;
    local_4e8.z = ON_3dVector::YAxis.z;
    local_4e8.x = ON_3dVector::YAxis.x;
    local_4e8.y = ON_3dVector::YAxis.y;
  }
  else {
    ON_Viewport::CameraX(local_550);
    ON_Viewport::CameraY(this_01);
  }
  ON_CrossProduct(&local_3b0,&local_548,&local_4e8);
  pOVar9 = ON_Annotation::Plane(&local_590->super_ON_Annotation);
  pOVar11 = &local_130;
  for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pOVar11->origin).x = (pOVar9->origin).x;
    pOVar9 = (ON_Plane *)((long)pOVar9 + (ulong)bVar16 * -0x10 + 8);
    pOVar11 = (ON_Plane *)((long)pOVar11 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  halign = ON_DimStyle::LeaderTextHorizontalAlignment(dimstyle);
  TVar4 = ON_DimStyle::LeaderTextVerticalAlignment(dimstyle);
  if (halign == Auto) {
    dVar20 = ON_3dVector::operator*(&local_130.xaxis,&local_548);
    halign = ((double)(~-(ulong)(local_578.x < -1e-05) & (ulong)dVar20 |
                      (ulong)-dVar20 & -(ulong)(local_578.x < -1e-05)) <= -1e-05) * '\x02';
  }
  TVar5 = ON_TextContent::RuntimeHorizontalAlignment(this_02);
  ON_TextContent::SetRuntimeHorizontalAlignment(this_02,halign);
  if (TVar5 != halign) {
    ON_TextContent::SetAlignment(this_02,halign,TVar4);
  }
  ON_Annotation::DimStyleTextPositionPropertiesHash
            ((ON_SHA1_Hash *)&local_430,&local_590->super_ON_Annotation);
  ON_DimStyle::TextPositionPropertiesHash((ON_SHA1_Hash *)&local_230,dimstyle);
  bVar6 = ::operator!=((ON_SHA1_Hash *)&local_430,(ON_SHA1_Hash *)&local_230);
  if (bVar6) {
    pwVar10 = ON_TextContent::RtfText(this_02);
    ON_wString::ON_wString((ON_wString *)&local_430,pwVar10);
    pwVar10 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&local_430);
    bVar6 = ON_TextContent::TextIsWrapped(this_02);
    local_5d0 = ON_TextContent::FormattingRectangleWidth(this_02);
    dVar20 = ON_TextContent::TextRotationRadians(this_02);
    ON_TextContent::Create(this_02,pwVar10,Leader,dimstyle,bVar6,local_5d0,dVar20);
    ON_TextContent::SetAlignment(this_02,halign,TVar4);
    ON_wString::~ON_wString((ON_wString *)&local_430);
  }
  ON_2dPoint::ON_2dPoint(&local_240,0.0,0.0);
  bVar6 = ON_TextContent::Get2dCorners(this_02,&local_388);
  if (!bVar6) goto LAB_004c8b1f;
  OVar22 = ON_2dPoint::operator+(&local_388,&local_368);
  local_430.m_xform[0][1] = OVar22.y;
  local_430.m_xform[0][0] = OVar22.x;
  OVar22 = ON_2dPoint::operator/((ON_2dPoint *)&local_430,2.0);
  local_4d0 = OVar22.y;
  local_398._8_4_ = extraout_XMM0_Dc;
  local_398._0_8_ = OVar22.x;
  local_398._12_4_ = extraout_XMM0_Dd;
  local_568 = local_378 - local_388.x;
  local_5b8 = local_350 - local_388.y;
  local_5d0 = ON_DimStyle::TextHeight(dimstyle);
  local_5b0 = 0.0;
  if (local_5a8._0_1_ == '\x02') goto switchD_004c80cc_caseD_3;
  TVar4 = ON_DimStyle::LeaderTextVerticalAlignment(dimstyle);
  switch(TVar4) {
  case Top:
    uVar18 = 0xbfe00000;
    goto LAB_004c8165;
  case MiddleOfTop:
    local_5b0 = local_5d0 * 0.5 - local_5b8 * 0.5;
    break;
  case BottomOfTop:
    dVar20 = local_5b8 * -0.5;
    local_5b0 = local_5d0;
    goto LAB_004c8107;
  case MiddleOfBottom:
    local_5b0 = local_5b8 * 0.5 - local_5d0 * 0.5;
    break;
  case Bottom:
    uVar18 = 0x3fe00000;
LAB_004c8165:
    local_5b0 = (double)((ulong)uVar18 << 0x20) * local_5b8;
    break;
  case BottomOfBoundingBox:
    dVar20 = ON_DimStyle::TextGap(dimstyle);
    local_5b0 = local_5b8 * 0.5;
LAB_004c8107:
    local_5b0 = local_5b0 + dVar20;
  }
switchD_004c80cc_caseD_3:
  ON_2dPoint::ON_2dPoint(&local_5c8,0.0,0.0);
  lVar12 = (long)(local_590->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count;
  if (0 < lVar12) {
    pOVar1 = (local_590->m_points).super_ON_SimpleArray<ON_2dPoint>.m_a + lVar12 + -1;
    local_5c8.x = pOVar1->x;
    local_5c8.y = pOVar1->y;
  }
  bVar6 = ON_DimStyle::LeaderHasLanding(dimstyle);
  local_5a0 = 0.0;
  if (bVar6) {
    local_5a0 = ON_DimStyle::LeaderLandingLength(dimstyle);
  }
  local_5d0 = ON_DimStyle::TextGap(dimstyle);
  if (local_5a8._0_1_ != '\0') {
    this_03 = ON_DimStyle::TextMask(dimstyle);
    dVar20 = ON_TextMask::MaskBorder(this_03);
    local_5d0 = local_5d0 + dVar20;
  }
  if (local_5a8._0_1_ == '\x02') {
    dVar20 = (local_5b8 * 0.5 + local_5d0) * local_560;
    ON_2dVector::ON_2dVector((ON_2dVector *)&local_430,dVar20,dVar20);
    local_5a8 = ON_2dVector::Length((ON_2dVector *)&local_430);
    uVar17 = SUB84(local_5a8,0);
    uVar19 = (undefined4)((ulong)local_5a8 >> 0x20);
    if (0.0 < local_5a0) {
      ON_2dVector::ON_2dVector
                ((ON_2dVector *)&local_430,
                 *(double *)(&DAT_006a8450 + (ulong)(local_578.x < 0.0) * 8),0.0);
      local_578.x = local_430.m_xform[0][0];
      local_578.y = local_430.m_xform[0][1];
      OVar21 = ON_2dVector::operator*(&local_578,local_5a0);
      local_430.m_xform[0][1] = OVar21.y;
      local_430.m_xform[0][0] = OVar21.x;
      OVar22 = ON_2dPoint::operator+(&local_5c8,(ON_2dVector *)&local_430);
      local_5c8.y = OVar22.y;
      local_5c8.x = OVar22.x;
      uVar17 = SUB84(local_5a8,0);
      uVar19 = (undefined4)((ulong)local_5a8 >> 0x20);
    }
    if (((CVar3 != Aligned) || (local_5a0 != 0.0)) || (NAN(local_5a0))) {
      if ((0.1 < ABS(local_578.x)) && (local_5b8 < local_568)) {
        dVar20 = (local_568 * 0.5 + local_5d0) - (double)CONCAT44(uVar19,uVar17) * 0.5;
        if (local_578.x <= 0.0) {
          local_5c8.x = local_5c8.x - dVar20;
        }
        else {
          local_5c8.x = dVar20 + local_5c8.x;
        }
      }
    }
    else {
      OVar21 = ON_2dVector::operator*
                         (&local_578,
                          (local_568 * 0.5 + local_5d0) - (double)CONCAT44(uVar19,uVar17) * 0.5);
      local_430.m_xform[0][1] = OVar21.y;
      local_430.m_xform[0][0] = OVar21.x;
      OVar22 = ON_2dPoint::operator+(&local_5c8,(ON_2dVector *)&local_430);
      local_5c8.y = OVar22.y;
      local_5c8.x = OVar22.x;
      uVar17 = SUB84(local_5a8,0);
      uVar19 = (undefined4)((ulong)local_5a8 >> 0x20);
    }
    OVar21 = ON_2dVector::operator*(&local_578,(double)CONCAT44(uVar19,uVar17));
    local_430.m_xform[0][1] = OVar21.y;
    local_430.m_xform[0][0] = OVar21.x;
    OVar22 = ON_2dPoint::operator+(&local_5c8,(ON_2dVector *)&local_430);
    local_5c8.y = OVar22.y;
    uVar17 = OVar22.x._0_4_;
    uVar19 = OVar22.x._4_4_;
  }
  else {
    OVar21 = ON_2dVector::operator*
                       (&local_578,(local_568 * 0.5 + local_5a0 + local_5d0) * local_560);
    local_430.m_xform[0][1] = OVar21.y;
    local_430.m_xform[0][0] = OVar21.x;
    OVar22 = ON_2dPoint::operator+(&local_5c8,(ON_2dVector *)&local_430);
    local_5c8.y = OVar22.y;
    uVar17 = OVar22.x._0_4_;
    uVar19 = OVar22.x._4_4_;
  }
  local_5c8.x = (double)CONCAT44(uVar19,uVar17);
  pOVar9 = ON_Annotation::Plane(&local_590->super_ON_Annotation);
  ON_2dVector::ON_2dVector(&local_588,1.0,0.0);
  if (CVar3 == Rotated) {
    local_588.x = local_578.x;
    local_588.y = local_578.y;
  }
  else if (CVar3 == Aligned) {
    local_588.x = local_578.x;
    local_588.y = local_578.y;
    if (local_578.x < 0.0) {
      OVar21 = ON_2dVector::operator-(&local_588);
      local_588.y = OVar21.y;
      local_588.x = OVar21.x;
    }
  }
  bVar6 = ON_2dVector::Unitize(&local_588);
  if (!bVar6) {
    ON_2dVector::Set(&local_588,1.0,0.0);
  }
  ON_Xform::DiagonalTransformation(&local_430,local_560);
  pOVar13 = &ON_Xform::IdentityTransformation;
  pOVar14 = &local_230;
  for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
    pOVar14->m_xform[0][0] = pOVar13->m_xform[0][0];
    pOVar13 = (ON_Xform *)((long)pOVar13 + ((ulong)bVar16 * -2 + 1) * 8);
    pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  pOVar13 = &ON_Xform::IdentityTransformation;
  pOVar14 = &local_340;
  for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
    pOVar14->m_xform[0][0] = pOVar13->m_xform[0][0];
    pOVar13 = (ON_Xform *)((long)pOVar13 + ((ulong)bVar16 * -2 + 1) * 8);
    pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  pOVar13 = &ON_Xform::IdentityTransformation;
  pOVar14 = &local_b0;
  for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
    pOVar14->m_xform[0][0] = pOVar13->m_xform[0][0];
    pOVar13 = (ON_Xform *)((long)pOVar13 + ((ulong)bVar16 * -2 + 1) * 8);
    pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  ON_Xform::Rotation(&local_b0,&ON_Plane::World_xy,pOVar9);
  pOVar13 = &ON_Xform::IdentityTransformation;
  pOVar14 = &local_1b0;
  for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
    pOVar14->m_xform[0][0] = pOVar13->m_xform[0][0];
    pOVar13 = (ON_Xform *)((long)pOVar13 + ((ulong)bVar16 * -2 + 1) * 8);
    pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  ON_2dVector::ON_2dVector((ON_2dVector *)&local_2c0,&local_5c8);
  ON_Xform::TranslationTransformation(&local_4c8,(ON_2dVector *)&local_2c0);
  pOVar13 = &local_4c8;
  pOVar14 = &local_1b0;
  for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
    pOVar14->m_xform[0][0] = pOVar13->m_xform[0][0];
    pOVar13 = (ON_Xform *)((long)pOVar13 + ((ulong)bVar16 * -2 + 1) * 8);
    pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  axis.y = ON_3dVector::ZAxis.y;
  axis.x = ON_3dVector::ZAxis.x;
  axis.z = ON_3dVector::ZAxis.z;
  center.y = ON_3dPoint::Origin.y;
  center.x = ON_3dPoint::Origin.x;
  center.z = ON_3dPoint::Origin.z;
  ON_Xform::Rotation(&local_340,local_588.y,local_588.x,axis,center);
  local_230.m_xform[0][3] = -local_398._0_8_;
  local_230.m_xform[1][3] = local_5b0 - local_4d0;
  TVar7 = ON_DimStyle::LeaderTextOrientation(dimstyle);
  this_00 = local_590;
  if (TVar7 == InView) {
    pOVar9 = ON_Annotation::Plane(&local_590->super_ON_Annotation);
    pOVar11 = ON_Annotation::Plane(&this_00->super_ON_Annotation);
    ON_Plane::PointAt((ON_3dPoint *)&local_2c0,pOVar11,local_5c8.x,local_5c8.y);
    ON_Xform::Rotation(&local_340,(ON_3dPoint *)&local_2c0,&pOVar9->xaxis,&pOVar9->yaxis,
                       &pOVar9->zaxis,(ON_3dPoint *)&local_2c0,&local_548,&local_4e8,&local_3b0);
    ON_Xform::operator*(&local_4c8,&local_430,&local_230);
    pOVar13 = local_558;
    pOVar14 = &local_4c8;
    pOVar15 = local_558;
    for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
      pOVar15->m_xform[0][0] = pOVar14->m_xform[0][0];
      pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
      pOVar15 = (ON_Xform *)((long)pOVar15 + ((ulong)bVar16 * -2 + 1) * 8);
    }
    ON_Xform::operator*(&local_4c8,&local_1b0,local_558);
    pOVar14 = &local_4c8;
    pOVar15 = pOVar13;
    for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
      pOVar15->m_xform[0][0] = pOVar14->m_xform[0][0];
      pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
      pOVar15 = (ON_Xform *)((long)pOVar15 + ((ulong)bVar16 * -2 + 1) * 8);
    }
    ON_Xform::operator*(&local_4c8,&local_b0,pOVar13);
    pOVar14 = &local_4c8;
    pOVar15 = pOVar13;
    for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
      pOVar15->m_xform[0][0] = pOVar14->m_xform[0][0];
      pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
      pOVar15 = (ON_Xform *)((long)pOVar15 + ((ulong)bVar16 * -2 + 1) * 8);
    }
    ON_Xform::operator*(&local_4c8,&local_340,pOVar13);
  }
  else {
    bVar6 = ON_DimStyle::DrawForward(dimstyle);
    if ((bVar6) && (bVar6 = ON_DimStyle::DrawForward(dimstyle), bVar6)) {
      local_508.z = (pOVar9->xaxis).z;
      local_508.x = (pOVar9->xaxis).x;
      local_508.y = (pOVar9->xaxis).y;
      local_528.z = (pOVar9->yaxis).z;
      local_528.x = (pOVar9->yaxis).x;
      local_528.y = (pOVar9->yaxis).y;
      local_448.z = (pOVar9->zaxis).z;
      local_448.x = (pOVar9->zaxis).x;
      local_448.y = (pOVar9->zaxis).y;
      dVar20 = ON_3dVector::operator*(&local_448,&local_3b0);
      if (0.0 <= dVar20) {
        ON_3dVector::Transform(&local_508,&local_340);
        ON_3dVector::Transform(&local_528,&local_340);
        ON_3dVector::Transform(&local_448,&local_340);
      }
      else {
        ON_Xform::Inverse(&local_4c8,&local_340,(double *)0x0);
        ON_3dVector::Transform(&local_508,&local_4c8);
        ON_3dVector::Transform(&local_528,&local_4c8);
        ON_3dVector::Transform(&local_448,&local_4c8);
      }
      if (local_598 != (ON_Xform *)0x0) {
        ON_3dVector::Transform(&local_508,local_598);
        ON_3dVector::Transform(&local_528,local_598);
        ON_3dVector::Transform(&local_448,local_598);
      }
      local_5d1 = false;
      local_5d2 = false;
      if (local_550 == (ON_Viewport *)0x0) {
LAB_004c8917:
        uVar17 = 0xc9f7dc37;
        uVar19 = 0x3fa1de58;
      }
      else {
        vVar8 = ON_Viewport::Projection(local_550);
        uVar17 = 0;
        uVar19 = 0;
        if (vVar8 != perspective_view) goto LAB_004c8917;
      }
      ON_Annotation::CalcTextFlip
                (&local_508,&local_528,&local_448,&local_548,&local_4e8,&local_3b0,local_598,
                 (double)CONCAT44(uVar19,uVar17),&local_5d1,&local_5d2);
      ON_Xform::ON_Xform(&local_4c8);
      if (local_5d1 == true) {
        point_on_mirror_plane.y = ON_3dPoint::Origin.y;
        point_on_mirror_plane.x = ON_3dPoint::Origin.x;
        point_on_mirror_plane.z = ON_3dPoint::Origin.z;
        normal_to_mirror_plane.y = ON_3dVector::XAxis.y;
        normal_to_mirror_plane.x = ON_3dVector::XAxis.x;
        normal_to_mirror_plane.z = ON_3dVector::XAxis.z;
        ON_Xform::Mirror(&local_4c8,point_on_mirror_plane,normal_to_mirror_plane);
        ON_Xform::operator*(&local_2c0,&local_430,&local_4c8);
        pOVar13 = &local_2c0;
        pOVar14 = &local_430;
        for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
          pOVar14->m_xform[0][0] = pOVar13->m_xform[0][0];
          pOVar13 = (ON_Xform *)((long)pOVar13 + ((ulong)bVar16 * -2 + 1) * 8);
          pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
        }
      }
      if (local_5d2 == true) {
        point_on_mirror_plane_00.y = ON_3dPoint::Origin.y;
        point_on_mirror_plane_00.x = ON_3dPoint::Origin.x;
        point_on_mirror_plane_00.z = ON_3dPoint::Origin.z;
        normal_to_mirror_plane_00.y = ON_3dVector::YAxis.y;
        normal_to_mirror_plane_00.x = ON_3dVector::YAxis.x;
        normal_to_mirror_plane_00.z = ON_3dVector::YAxis.z;
        ON_Xform::Mirror(&local_4c8,point_on_mirror_plane_00,normal_to_mirror_plane_00);
        ON_Xform::operator*(&local_2c0,&local_430,&local_4c8);
        pOVar13 = &local_2c0;
        pOVar14 = &local_430;
        for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
          pOVar14->m_xform[0][0] = pOVar13->m_xform[0][0];
          pOVar13 = (ON_Xform *)((long)pOVar13 + ((ulong)bVar16 * -2 + 1) * 8);
          pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
        }
      }
    }
    ON_Xform::operator*(&local_4c8,&local_430,&local_230);
    pOVar13 = local_558;
    pOVar14 = &local_4c8;
    pOVar15 = local_558;
    for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
      pOVar15->m_xform[0][0] = pOVar14->m_xform[0][0];
      pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
      pOVar15 = (ON_Xform *)((long)pOVar15 + ((ulong)bVar16 * -2 + 1) * 8);
    }
    ON_Xform::operator*(&local_4c8,&local_340,local_558);
    pOVar14 = &local_4c8;
    pOVar15 = pOVar13;
    for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
      pOVar15->m_xform[0][0] = pOVar14->m_xform[0][0];
      pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
      pOVar15 = (ON_Xform *)((long)pOVar15 + ((ulong)bVar16 * -2 + 1) * 8);
    }
    ON_Xform::operator*(&local_4c8,&local_1b0,pOVar13);
    pOVar14 = &local_4c8;
    pOVar15 = pOVar13;
    for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
      pOVar15->m_xform[0][0] = pOVar14->m_xform[0][0];
      pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
      pOVar15 = (ON_Xform *)((long)pOVar15 + ((ulong)bVar16 * -2 + 1) * 8);
    }
    ON_Xform::operator*(&local_4c8,&local_b0,pOVar13);
  }
  pOVar14 = &local_4c8;
  for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
    pOVar13->m_xform[0][0] = pOVar14->m_xform[0][0];
    pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
    pOVar13 = (ON_Xform *)((long)pOVar13 + ((ulong)bVar16 * -2 + 1) * 8);
  }
LAB_004c8b1f:
  ON_Plane::~ON_Plane(&local_130);
LAB_004c8b2c:
  return dimstyle != (ON_DimStyle *)0x0;
}

Assistant:

bool ON_Leader::GetTextXform(
  const ON_Xform* model_xform,
  const ON_Viewport* vp,
  const ON_DimStyle* dimstyle,
  double dimscale,
  ON_Xform& text_xform_out
) const
{
  if (nullptr == dimstyle)
    return false;

  const ON_TextContent* text = Text();
  if (nullptr == text)
    return true;

  const ON_TextMask::MaskFrame maskframe = dimstyle->MaskFrameType();
  const ON_DimStyle::ContentAngleStyle textangle_style = dimstyle->LeaderContentAngleStyle();

  ON_2dVector tail_dir = TailDirection(dimstyle);
  ON_3dVector view_x = nullptr == vp ? ON_3dVector::XAxis : vp->CameraX();
  ON_3dVector view_y = nullptr == vp ? ON_3dVector::YAxis : vp->CameraY();
  ON_3dVector view_z = ON_CrossProduct(view_x, view_y);
  ON_Plane objectplane = Plane();
  ON::TextHorizontalAlignment halign = dimstyle->LeaderTextHorizontalAlignment();
  ON::TextVerticalAlignment valign = dimstyle->LeaderTextVerticalAlignment();
  if (ON::TextHorizontalAlignment::Auto == halign)
  {
    double xdotx = objectplane.xaxis * view_x;
    if (tail_dir.x < -0.00001)
      xdotx = -xdotx;
    if (xdotx > -0.00001)
      halign = ON::TextHorizontalAlignment::Left;
    else
      halign = ON::TextHorizontalAlignment::Right;
  }
  ON::TextHorizontalAlignment last_halign = text->RuntimeHorizontalAlignment();
  text->SetRuntimeHorizontalAlignment(halign);

  if (last_halign != halign)
  {
    const_cast<ON_TextContent*>(text)->SetAlignment(halign, valign);
  }
  if (DimStyleTextPositionPropertiesHash() != dimstyle->TextPositionPropertiesHash())
  {
    ON_wString rtfstr = text->RtfText();
    const_cast<ON_TextContent*>(text)->Create(
      rtfstr, ON::AnnotationType::Leader, dimstyle,
      text->TextIsWrapped(), text->FormattingRectangleWidth(), text->TextRotationRadians());

    const_cast<ON_TextContent*>(text)->SetAlignment(halign, valign);
  }

  // Find center of scaled text
  double textblock_width = 0.0;
  double textblock_height = 0.0;
  double line_height = 1.0;

  ON_2dPoint text_corners[4];
  ON_2dPoint text_center;
  ON_2dPoint text_pt(0.0, 0.0);
  if (text->Get2dCorners(text_corners)) // Gets unscaled 3d size
  {
    text_center = (text_corners[0] + text_corners[2]) / 2.0;
    textblock_width = (text_corners[1].x - text_corners[0].x);
    textblock_height = (text_corners[3].y - text_corners[0].y);
    line_height = dimstyle->TextHeight();

    ON_2dVector text_shift;
    text_shift.x = 0.0;
    text_shift.y = 0.0;

    if (ON_TextMask::MaskFrame::CapsuleFrame != maskframe)
    {
      // LeaderAttachStyle - Vertical alignment of text with leader text point
      ON::TextVerticalAlignment attach = dimstyle->LeaderTextVerticalAlignment();
      switch (attach)
      {
      case ON::TextVerticalAlignment::Top:
        text_shift.y = -textblock_height / 2.0;
        break;
      case ON::TextVerticalAlignment::MiddleOfTop:
        text_shift.y = -(textblock_height / 2.0) + (line_height / 2.0);
        break;
      case ON::TextVerticalAlignment::BottomOfTop:
        text_shift.y = -(textblock_height / 2.0) + line_height;
        break;
      case ON::TextVerticalAlignment::Middle:
        text_shift.y = 0.0;
        break;
      case ON::TextVerticalAlignment::MiddleOfBottom:
        text_shift.y = (textblock_height / 2.0) - (line_height / 2.0);
        break;
      case ON::TextVerticalAlignment::Bottom:
        text_shift.y = textblock_height / 2.0;
        break;
      case ON::TextVerticalAlignment::BottomOfBoundingBox:
        text_shift.y = (textblock_height / 2.0) + (dimstyle->TextGap());   /*(line_height / 10.0);*/
        break;
      }
    }

    // 2d Point at center of text but without vertical alignment shift
    ON_2dPoint text_pt2(0.0, 0.0);
    if (0 < m_points.Count())
      text_pt2 = m_points[m_points.Count() - 1];

    double landing_length = 0.0;
    if (dimstyle->LeaderHasLanding())
      landing_length = dimstyle->LeaderLandingLength();
    double text_gap = dimstyle->TextGap();

    if (maskframe != ON_TextMask::MaskFrame::NoFrame)
    {
      text_gap += dimstyle->TextMask().MaskBorder(); // RH-71452
    }

    if (maskframe == ON_TextMask::MaskFrame::CapsuleFrame)
    {
      double half_height = dimscale * (textblock_height * 0.5 + text_gap);
      double radius = ON_2dVector(half_height, half_height).Length();
      if (landing_length > 0.0)
      {
        tail_dir = tail_dir.x < 0 ? ON_2dVector(-1, 0) : ON_2dVector(1, 0);
        text_pt2 = text_pt2 + (tail_dir * landing_length);
      }

      if (ON_DimStyle::ContentAngleStyle::Aligned == textangle_style && landing_length == 0.0)
      {
        text_pt2 = text_pt2 + (tail_dir * (textblock_width * 0.5 + text_gap - radius * 0.5));
      }
      else if (fabs(tail_dir.x) > 0.1 && textblock_width > textblock_height)
      {
        if (tail_dir.x > 0)
        {
          text_pt2.x += (textblock_width * 0.5 + text_gap - radius * 0.5);
        }
        else
        {
          text_pt2.x -= (textblock_width * 0.5 + text_gap - radius * 0.5);
        }
      }
      text_pt2 = text_pt2 + (tail_dir * radius);
    }
    else
    {
      double x_offset = dimscale * (landing_length + text_gap + textblock_width / 2.0);

      text_pt2 = text_pt2 + (tail_dir * x_offset);
    }

    // Move from Origin to leader plane
    const ON_Plane& leaderplane = Plane();

    ON_2dVector text_dir(1.0, 0.0);     // Horizontal to cplane - ON_DimStyle::ContentAngleStyle::Horizontal
    if (ON_DimStyle::ContentAngleStyle::Aligned == textangle_style)
    {
      text_dir = tail_dir;
      if (text_dir.x < 0.0)
        text_dir = -text_dir;
    }
    else if (ON_DimStyle::ContentAngleStyle::Rotated == textangle_style)
    {
      text_dir = tail_dir;  // Already has rotation included
    }
    if (!text_dir.Unitize())
      text_dir.Set(1.0, 0.0);

    ON_Xform textscale_xf(ON_Xform::DiagonalTransformation(dimscale));
    ON_Xform textcenter_xf(ON_Xform::IdentityTransformation);        // Centers text block at origin
    ON_Xform textrotation_xf(ON_Xform::IdentityTransformation);      // Text rotation around origin

    ON_Xform world_to_leader_xf(ON_Xform::IdentityTransformation);   // WCS plane to leader plane rotation
    world_to_leader_xf.Rotation(ON_Plane::World_xy, leaderplane);    // Rotate text from starting text plane (wcs) to leader plane

    ON_Xform leader_to_text_pt_xf(ON_Xform::IdentityTransformation); // Leader plane to text point translation
    leader_to_text_pt_xf = ON_Xform::TranslationTransformation(text_pt2);

    textrotation_xf.Rotation(text_dir.y, text_dir.x, ON_3dVector::ZAxis, ON_3dPoint::Origin);

    textcenter_xf.m_xform[0][3] = -text_center.x;
    textcenter_xf.m_xform[1][3] = -text_center.y + text_shift.y;

    if (ON::TextOrientation::InView == dimstyle->LeaderTextOrientation())
    {
      const ON_Plane& ldrplane = Plane();
      ON_3dPoint text_point_3d = Plane().PointAt(text_pt2.x, text_pt2.y);
      textrotation_xf.Rotation(text_point_3d, ldrplane.xaxis, ldrplane.yaxis, ldrplane.zaxis, text_point_3d, view_x, view_y, view_z);
      text_xform_out = textscale_xf * textcenter_xf;
      text_xform_out = leader_to_text_pt_xf * text_xform_out;
      text_xform_out = world_to_leader_xf * text_xform_out;
      text_xform_out = textrotation_xf * text_xform_out;
      return true;
    }
    else if (dimstyle->DrawForward())
    {
      if (dimstyle->DrawForward())
      {
        // Check if the text is right-reading by comparing
        // text plane x and y, rotated by text rotation angle,
        // to view right and up

        ON_3dVector text_xdir = leaderplane.xaxis;
        ON_3dVector text_ydir = leaderplane.yaxis;
        ON_3dVector text_zdir = leaderplane.zaxis;
        if (text_zdir * view_z < 0.0)
        {
          ON_Xform xfr = textrotation_xf.Inverse();
          text_xdir.Transform(xfr);
          text_ydir.Transform(xfr);
          text_zdir.Transform(xfr);
        }
        else
        {
          text_xdir.Transform(textrotation_xf);
          text_ydir.Transform(textrotation_xf);
          text_zdir.Transform(textrotation_xf);
        }

        if (nullptr != model_xform)
        {
          text_xdir.Transform(*model_xform);
          text_ydir.Transform(*model_xform);
          text_zdir.Transform(*model_xform);
        }

        bool flip_x = false;
        bool flip_y = false;
        const double fliptol = (nullptr != vp && vp->Projection() == ON::view_projection::perspective_view) ? 0.0 : cos(88.0 * ON_DEGREES_TO_RADIANS);
        CalcTextFlip(
          text_xdir, text_ydir, text_zdir,
          view_x, view_y, view_z,
          model_xform,
          fliptol,
          flip_x,
          flip_y);

        ON_Xform mxf;
        if (flip_x)
        {
          mxf.Mirror(ON_3dPoint::Origin, ON_3dVector::XAxis);
          textscale_xf = textscale_xf * mxf;
        }
        if (flip_y)
        {
          mxf.Mirror(ON_3dPoint::Origin, ON_3dVector::YAxis);
          textscale_xf = textscale_xf * mxf;
        }
      }
    }

    text_xform_out = textscale_xf * textcenter_xf;
    text_xform_out = textrotation_xf * text_xform_out;
    text_xform_out = leader_to_text_pt_xf * text_xform_out;
    text_xform_out = world_to_leader_xf * text_xform_out;
  }
  return true;
}